

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot returnValueRegister,
          RegSlot functionRegister,ArgSlot givenArgCount,AsmJsRetType retType)

{
  bool bVar1;
  Which WVar2;
  unsigned_short local_31;
  uint uStack_2f;
  undefined1 auStack_2b [2];
  OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  ArgSlot givenArgCount_local;
  RegSlot functionRegister_local;
  RegSlot returnValueRegister_local;
  OpCodeAsmJs op_local;
  AsmJsByteCodeWriter *this_local;
  AsmJsRetType retType_local;
  
  layout.Return._1_2_ = givenArgCount;
  layout._5_4_ = functionRegister;
  unique0x100000e8 = returnValueRegister;
  this_local._0_4_ = retType.which_;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&uStack_2f,returnValueRegister);
  if (((bVar1) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>
                         ((uint *)auStack_2b,layout._5_4_), bVar1)) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_short>
                        (&local_31,layout.Return._1_2_), bVar1)) {
    WVar2 = AsmJsRetType::which((AsmJsRetType *)&this_local);
    bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<char>((char *)&layout.Return,(char)WVar2);
    if (bVar1) {
      ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>
                (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_31,0xb,
                 &this->super_ByteCodeWriter,false);
      return true;
    }
  }
  return false;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmCall(OpCodeAsmJs op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, AsmJsRetType retType)
    {
        OpLayoutT_AsmCall<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::template Assign<int8>(layout.ReturnType, (int8)retType.which()))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }